

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-target.inc.c
# Opt level: O0

void tcg_out_nopn(TCGContext_conflict9 *s,int n)

{
  undefined4 local_18;
  int i;
  int n_local;
  TCGContext_conflict9 *s_local;
  
  for (local_18 = 1; local_18 < n; local_18 = local_18 + 1) {
    tcg_out8(s,'f');
  }
  tcg_out8(s,0x90);
  return;
}

Assistant:

static void tcg_out_nopn(TCGContext *s, int n)
{
    int i;
    /* Emit 1 or 2 operand size prefixes for the standard one byte nop,
     * "xchg %eax,%eax", forming "xchg %ax,%ax". All cores accept the
     * duplicate prefix, and all of the interesting recent cores can
     * decode and discard the duplicates in a single cycle.
     */
    tcg_debug_assert(n >= 1);
    for (i = 1; i < n; ++i) {
        tcg_out8(s, 0x66);
    }
    tcg_out8(s, 0x90);
}